

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_msgs.c
# Opt level: O3

void warnf(Configurable *config,char *fmt,...)

{
  long lVar1;
  bool bVar2;
  long lVar3;
  uint uVar4;
  int iVar5;
  ushort **ppuVar6;
  long lVar7;
  uint uVar8;
  char *__s;
  va_list ap;
  char print_buffer [256];
  char local_138 [264];
  
  if (config->mute == false) {
    __s = local_138;
    uVar4 = curl_mvsnprintf(__s,0x100,fmt);
    if (0 < (int)uVar4) {
      do {
        fputs("Warning: ",(FILE *)config->errors);
        if (uVar4 < 0x47) {
          fputs(__s,(FILE *)config->errors);
          return;
        }
        ppuVar6 = __ctype_b_loc();
        lVar7 = 0x46;
        do {
          lVar1 = lVar7 + -1;
          if (lVar7 == 1) break;
          lVar3 = lVar7 + -1;
          lVar7 = lVar1;
        } while (((*ppuVar6)[(byte)__s[lVar3]] & 0x2000) == 0);
        iVar5 = (int)lVar1;
        if (lVar1 == 0) {
          iVar5 = 0x45;
        }
        fwrite(__s,(long)iVar5 + 1,1,(FILE *)config->errors);
        fputs("\n",(FILE *)config->errors);
        __s = __s + (long)iVar5 + 1;
        uVar8 = uVar4 - iVar5;
        bVar2 = iVar5 <= (int)uVar4;
        uVar4 = uVar8;
      } while (uVar8 != 0 && bVar2);
    }
  }
  return;
}

Assistant:

void warnf(struct Configurable *config, const char *fmt, ...)
{
  if(!config->mute) {
    va_list ap;
    int len;
    char *ptr;
    char print_buffer[256];

    va_start(ap, fmt);
    len = vsnprintf(print_buffer, sizeof(print_buffer), fmt, ap);
    va_end(ap);

    ptr = print_buffer;
    while(len > 0) {
      fputs(WARN_PREFIX, config->errors);

      if(len > (int)WARN_TEXTWIDTH) {
        int cut = WARN_TEXTWIDTH-1;

        while(!ISSPACE(ptr[cut]) && cut) {
          cut--;
        }
        if(0 == cut)
          /* not a single cutting position was found, just cut it at the
             max text width then! */
          cut = WARN_TEXTWIDTH-1;

        (void)fwrite(ptr, cut + 1, 1, config->errors);
        fputs("\n", config->errors);
        ptr += cut+1; /* skip the space too */
        len -= cut;
      }
      else {
        fputs(ptr, config->errors);
        len = 0;
      }
    }
  }
}